

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O1

Block * __thiscall FMemArena::AddBlock(FMemArena *this,size_t size)

{
  ulong uVar1;
  Block *pBVar2;
  Block *pBVar3;
  ulong uVar4;
  size_t size_00;
  
  uVar4 = size + 0x18;
  pBVar3 = (Block *)&this->FreeBlocks;
  do {
    pBVar2 = pBVar3;
    pBVar3 = pBVar2->NextBlock;
    if (pBVar3 == (Block *)0x0) {
      uVar1 = this->BlockSize;
      size_00 = (uVar1 >> 1) + uVar4;
      if (uVar4 < uVar1) {
        size_00 = uVar1;
      }
      pBVar3 = (Block *)M_Malloc_Dbg(size_00,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/memarena.cpp"
                                     ,0xca);
      pBVar3->Limit = (void *)((long)&pBVar3->NextBlock + size_00);
      goto LAB_003a3f21;
    }
  } while ((long)pBVar3->Limit - (long)pBVar3 < (long)uVar4);
  pBVar2->NextBlock = pBVar3->NextBlock;
LAB_003a3f21:
  pBVar3->Avail = pBVar3 + 0x18;
  pBVar3->NextBlock = this->TopBlock;
  this->TopBlock = pBVar3;
  return pBVar3;
}

Assistant:

FMemArena::Block *FMemArena::AddBlock(size_t size)
{
	Block *mem, **last;
	size += sizeof(Block);		// Account for header size

	// Search for a free block to use
	for (last = &FreeBlocks, mem = FreeBlocks; mem != NULL; last = &mem->NextBlock, mem = mem->NextBlock)
	{
		if ((BYTE *)mem->Limit - (BYTE *)mem >= (ptrdiff_t)size)
		{
			*last = mem->NextBlock;
			break;
		}
	}
	if (mem == NULL)
	{
		// Allocate a new block
		if (size < BlockSize)
		{
			size = BlockSize;
		}
		else
		{ // Stick some free space at the end so we can use this block for
		  // other things.
			size += BlockSize/2;
		}
		mem = (Block *)M_Malloc(size);
		mem->Limit = (BYTE *)mem + size;
	}
	mem->Reset();
	mem->NextBlock = TopBlock;
	TopBlock = mem;
	return mem;
}